

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::detail::
int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>::on_oct
          (int_writer<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  basic_format_specs<char> *specs;
  buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  ulong uVar4;
  char *__dest;
  byte *pbVar5;
  ulong __n;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  ptrdiff_t _Num;
  buffer<char> *c;
  ulong uVar9;
  long lVar10;
  string_view prefix;
  write_int_data<char> data;
  char *in_stack_ffffffffffffff98;
  write_int_data<char> local_40;
  
  lVar10 = 0;
  uVar6 = this->abs_value;
  do {
    lVar10 = lVar10 + 1;
    bVar3 = 7 < uVar6;
    uVar6 = uVar6 >> 3;
  } while (bVar3);
  specs = this->specs;
  if (((char)specs->field_0x9 < '\0') && (this->abs_value != 0 && specs->precision <= (int)lVar10))
  {
    uVar6 = this->prefix_size;
    this->prefix_size = uVar6 + 1;
    this->prefix[uVar6] = '0';
  }
  pbVar1 = (this->out).container;
  pcVar8 = this->prefix;
  __n = (ulong)this->prefix_size;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.data_ = pcVar8;
  prefix.size_._4_4_ = 0;
  write_int_data<char>::write_int_data(&local_40,(int)lVar10,prefix,specs);
  uVar4 = (ulong)specs->width;
  if (-1 < (long)uVar4) {
    uVar9 = 0;
    if (local_40.size <= uVar4) {
      uVar9 = uVar4 - local_40.size;
    }
    uVar4 = uVar9 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = pbVar1->size_;
    uVar7 = local_40.size + sVar2 + (specs->fill).size_ * uVar9;
    if (pbVar1->capacity_ < uVar7) {
      (**pbVar1->_vptr_buffer)(pbVar1,uVar7);
    }
    pbVar1->size_ = uVar7;
    __dest = fill<char*,char>(pbVar1->ptr_ + sVar2,uVar4,&specs->fill);
    if (__n != 0) {
      memmove(__dest,pcVar8,__n);
      __dest = __dest + __n;
    }
    pcVar8 = __dest;
    if (local_40.padding != 0) {
      pcVar8 = __dest + local_40.padding;
      memset(__dest,0x30,local_40.padding);
    }
    pbVar5 = (byte *)(pcVar8 + lVar10);
    uVar6 = this->abs_value;
    do {
      pbVar5 = pbVar5 + -1;
      *pbVar5 = (byte)uVar6 & 7 | 0x30;
      bVar3 = 7 < uVar6;
      uVar6 = uVar6 >> 3;
    } while (bVar3);
    fill<char*,char>(pcVar8 + lVar10,uVar9 - uVar4,&specs->fill);
    (this->out).container = pbVar1;
    return;
  }
  assert_fail(pcVar8,0,in_stack_ffffffffffffff98);
}

Assistant:

void on_oct() {
    int num_digits = count_digits<3>(abs_value);
    if (specs.alt && specs.precision <= num_digits && abs_value != 0) {
      // Octal prefix '0' is counted as a digit, so only add it if precision
      // is not greater than the number of digits.
      prefix[prefix_size++] = '0';
    }
    out = write_int(out, num_digits, get_prefix(), specs,
                    [this, num_digits](iterator it) {
                      return format_uint<3, Char>(it, abs_value, num_digits);
                    });
  }